

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

UEnumeration *
ucurr_getKeywordValuesForLocale_63(char *key,char *locale,UBool commonlyUsed,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  UResType UVar3;
  int32_t iVar4;
  UList *list;
  UList *list_00;
  UEnumeration *en;
  UResourceBundle *resB;
  char *pcVar5;
  size_t sVar6;
  void *__dest;
  UList *list_01;
  int32_t curIDLength;
  char prefRegion [4];
  UResourceBundle bundlekey;
  UResourceBundle to;
  UResourceBundle curbndl;
  UResourceBundle regbndl;
  int32_t local_368;
  char local_364 [4];
  UList *local_360;
  char *local_358;
  UResourceBundle local_350;
  UResourceBundle local_288;
  UResourceBundle local_1c0;
  UResourceBundle local_f8;
  
  ulocimp_getRegionForSupplementalData_63(locale,'\x01',local_364,4,status);
  list = ulist_createEmptyList_63(status);
  list_00 = ulist_createEmptyList_63(status);
  en = (UEnumeration *)uprv_malloc_63(0x38);
  if ((en == (UEnumeration *)0x0) || (U_ZERO_ERROR < *status)) {
    if (en == (UEnumeration *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      uprv_free_63(en);
    }
    ulist_deleteList_63(list);
    ulist_deleteList_63(list_00);
    return (UEnumeration *)0x0;
  }
  en->baseContext = (void *)0x0;
  en->context = (void *)0x0;
  en->reset = ulist_reset_keyword_values_iterator_63;
  en->uNext = uenum_unextDefault_63;
  en->next = ulist_next_keyword_value_63;
  en->close = ulist_close_keyword_values_iterator_63;
  en->count = ulist_count_keyword_values_63;
  en->context = list;
  local_358 = key;
  resB = ures_openDirect_63("icudt63l-curr","supplementalData",status);
  ures_getByKey_63(resB,"CurrencyMap",resB,status);
  ures_initStackObject_63(&local_350);
  ures_initStackObject_63(&local_f8);
  ures_initStackObject_63(&local_1c0);
  ures_initStackObject_63(&local_288);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_360 = list_00;
    while (UVar1 = ures_hasNext_63(resB), UVar1 != '\0') {
      ures_getNextResource_63(resB,&local_350,status);
      if (U_ZERO_ERROR < *status) goto LAB_002b15d8;
      pcVar5 = ures_getKey_63(&local_350);
      iVar2 = strcmp(pcVar5,local_364);
      list_00 = local_360;
      if (commonlyUsed == '\0' || iVar2 == 0) {
        ures_getByKey_63(resB,pcVar5,&local_f8,status);
LAB_002b170b:
        do {
          if (U_ZERO_ERROR < *status) goto LAB_002b15d8;
          UVar1 = ures_hasNext_63(&local_f8);
          if (UVar1 == '\0') goto LAB_002b16ed;
          ures_getNextResource_63(&local_f8,&local_1c0,status);
          UVar3 = ures_getType_63(&local_1c0);
        } while (UVar3 != RES_TABLE);
        pcVar5 = (char *)uprv_malloc_63(0x60);
        local_368 = 0x60;
        if (pcVar5 != (char *)0x0) {
          ures_getUTF8StringByKey_63(&local_1c0,"id",pcVar5,&local_368,'\x01',status);
          if (U_ZERO_ERROR < *status) goto LAB_002b16ed;
          ures_getByKey_63(&local_1c0,"to",&local_288,status);
          if ((*status < U_ILLEGAL_ARGUMENT_ERROR) || (*status = U_ZERO_ERROR, iVar2 != 0)) {
LAB_002b17d1:
            sVar6 = strlen(pcVar5);
            UVar1 = ulist_containsString_63(list_00,pcVar5,(int32_t)sVar6);
            list_01 = list_00;
            if (UVar1 != '\0' || commonlyUsed != '\0') {
              uprv_free_63(pcVar5);
              goto LAB_002b170b;
            }
          }
          else {
            sVar6 = strlen(pcVar5);
            UVar1 = ulist_containsString_63(list,pcVar5,(int32_t)sVar6);
            list_01 = list;
            if (UVar1 != '\0') goto LAB_002b17d1;
          }
          ulist_addItemEndList_63(list_01,pcVar5,'\x01',status);
          goto LAB_002b170b;
        }
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
LAB_002b16ed:
      if (U_ZERO_ERROR < *status) goto LAB_002b15d8;
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if (commonlyUsed == '\0') {
        ulist_resetList_63(list_00);
        pcVar5 = (char *)ulist_getNext_63(list_00);
        goto joined_r0x002b188a;
      }
      iVar4 = ulist_getListSize_63(list);
      if (iVar4 == 0) {
        uenum_close_63(en);
        en = ucurr_getKeywordValuesForLocale_63(local_358,"und",'\x01',status);
      }
      goto LAB_002b1905;
    }
  }
LAB_002b15d8:
  ulist_deleteList_63(list);
  uprv_free_63(en);
  en = (UEnumeration *)0x0;
LAB_002b15f1:
  ures_close_63(&local_288);
  ures_close_63(&local_1c0);
  ures_close_63(&local_f8);
  ures_close_63(&local_350);
  ures_close_63(resB);
  ulist_deleteList_63(list_00);
  return en;
joined_r0x002b188a:
  if (pcVar5 == (char *)0x0) goto LAB_002b1905;
  sVar6 = strlen(pcVar5);
  UVar1 = ulist_containsString_63(list,pcVar5,(int32_t)sVar6);
  if (UVar1 == '\0') {
    __dest = uprv_malloc_63(0x60);
    sVar6 = strlen(pcVar5);
    memcpy(__dest,pcVar5,sVar6 + 1);
    list_00 = local_360;
    ulist_addItemEndList_63(list,__dest,'\x01',status);
    if (U_ZERO_ERROR < *status) goto LAB_002b1905;
  }
  pcVar5 = (char *)ulist_getNext_63(list_00);
  goto joined_r0x002b188a;
LAB_002b1905:
  ulist_resetList_63((UList *)en->context);
  goto LAB_002b15f1;
}

Assistant:

U_CAPI UEnumeration *U_EXPORT2 ucurr_getKeywordValuesForLocale(const char *key, const char *locale, UBool commonlyUsed, UErrorCode* status) {
    // Resolve region
    char prefRegion[ULOC_COUNTRY_CAPACITY];
    ulocimp_getRegionForSupplementalData(locale, TRUE, prefRegion, sizeof(prefRegion), status);
    
    // Read value from supplementalData
    UList *values = ulist_createEmptyList(status);
    UList *otherValues = ulist_createEmptyList(status);
    UEnumeration *en = (UEnumeration *)uprv_malloc(sizeof(UEnumeration));
    if (U_FAILURE(*status) || en == NULL) {
        if (en == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
        } else {
            uprv_free(en);
        }
        ulist_deleteList(values);
        ulist_deleteList(otherValues);
        return NULL;
    }
    memcpy(en, &defaultKeywordValues, sizeof(UEnumeration));
    en->context = values;
    
    UResourceBundle *bundle = ures_openDirect(U_ICUDATA_CURR, "supplementalData", status);
    ures_getByKey(bundle, "CurrencyMap", bundle, status);
    UResourceBundle bundlekey, regbndl, curbndl, to;
    ures_initStackObject(&bundlekey);
    ures_initStackObject(&regbndl);
    ures_initStackObject(&curbndl);
    ures_initStackObject(&to);
    
    while (U_SUCCESS(*status) && ures_hasNext(bundle)) {
        ures_getNextResource(bundle, &bundlekey, status);
        if (U_FAILURE(*status)) {
            break;
        }
        const char *region = ures_getKey(&bundlekey);
        UBool isPrefRegion = uprv_strcmp(region, prefRegion) == 0 ? TRUE : FALSE;
        if (!isPrefRegion && commonlyUsed) {
            // With commonlyUsed=true, we do not put
            // currencies for other regions in the
            // result list.
            continue;
        }
        ures_getByKey(bundle, region, &regbndl, status);
        if (U_FAILURE(*status)) {
            break;
        }
        while (U_SUCCESS(*status) && ures_hasNext(&regbndl)) {
            ures_getNextResource(&regbndl, &curbndl, status);
            if (ures_getType(&curbndl) != URES_TABLE) {
                // Currently, an empty ARRAY is mixed in.
                continue;
            }
            char *curID = (char *)uprv_malloc(sizeof(char) * ULOC_KEYWORDS_CAPACITY);
            int32_t curIDLength = ULOC_KEYWORDS_CAPACITY;
            if (curID == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }

#if U_CHARSET_FAMILY==U_ASCII_FAMILY
            ures_getUTF8StringByKey(&curbndl, "id", curID, &curIDLength, TRUE, status);
            /* optimize - use the utf-8 string */
#else
            {
                       const UChar* defString = ures_getStringByKey(&curbndl, "id", &curIDLength, status);
                       if(U_SUCCESS(*status)) {
			   if(curIDLength+1 > ULOC_KEYWORDS_CAPACITY) {
				*status = U_BUFFER_OVERFLOW_ERROR;
			   } else {
                           	u_UCharsToChars(defString, curID, curIDLength+1);
			   }
                       }
            }
#endif	

            if (U_FAILURE(*status)) {
                break;
            }
            UBool hasTo = FALSE;
            ures_getByKey(&curbndl, "to", &to, status);
            if (U_FAILURE(*status)) {
                // Do nothing here...
                *status = U_ZERO_ERROR;
            } else {
                hasTo = TRUE;
            }
            if (isPrefRegion && !hasTo && !ulist_containsString(values, curID, (int32_t)uprv_strlen(curID))) {
                // Currently active currency for the target country
                ulist_addItemEndList(values, curID, TRUE, status);
            } else if (!ulist_containsString(otherValues, curID, (int32_t)uprv_strlen(curID)) && !commonlyUsed) {
                ulist_addItemEndList(otherValues, curID, TRUE, status);
            } else {
                uprv_free(curID);
            }
        }
        
    }
    if (U_SUCCESS(*status)) {
        if (commonlyUsed) {
            if (ulist_getListSize(values) == 0) {
                // This could happen if no valid region is supplied in the input
                // locale. In this case, we use the CLDR's default.
                uenum_close(en);
                en = ucurr_getKeywordValuesForLocale(key, "und", TRUE, status);
            }
        } else {
            // Consolidate the list
            char *value = NULL;
            ulist_resetList(otherValues);
            while ((value = (char *)ulist_getNext(otherValues)) != NULL) {
                if (!ulist_containsString(values, value, (int32_t)uprv_strlen(value))) {
                    char *tmpValue = (char *)uprv_malloc(sizeof(char) * ULOC_KEYWORDS_CAPACITY);
                    uprv_memcpy(tmpValue, value, uprv_strlen(value) + 1);
                    ulist_addItemEndList(values, tmpValue, TRUE, status);
                    if (U_FAILURE(*status)) {
                        break;
                    }
                }
            }
        }
        
        ulist_resetList((UList *)(en->context));
    } else {
        ulist_deleteList(values);
        uprv_free(en);
        values = NULL;
        en = NULL;
    }
    ures_close(&to);
    ures_close(&curbndl);
    ures_close(&regbndl);
    ures_close(&bundlekey);
    ures_close(bundle);
    
    ulist_deleteList(otherValues);
    
    return en;
}